

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O0

dynamic_string __thiscall crnlib::operator+(crnlib *this,dynamic_string *a,char *p)

{
  dynamic_string *other;
  char *extraout_RDX;
  dynamic_string dVar1;
  dynamic_string local_30;
  char *local_20;
  char *p_local;
  dynamic_string *a_local;
  
  local_20 = p;
  p_local = (char *)a;
  a_local = (dynamic_string *)this;
  dynamic_string::dynamic_string(&local_30,a);
  other = dynamic_string::append(&local_30,local_20);
  dynamic_string::dynamic_string((dynamic_string *)this,other);
  dynamic_string::~dynamic_string(&local_30);
  dVar1.m_pStr = extraout_RDX;
  dVar1._0_8_ = this;
  return dVar1;
}

Assistant:

dynamic_string operator+(const dynamic_string& a, const char* p)
    {
        return dynamic_string(a).append(p);
    }